

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int value;
  nn_symbol_properties sym;
  int local_3c;
  undefined1 local_38 [32];
  
  lVar3 = nn_symbol(0xffffffff,0);
  if (lVar3 == 0) {
    iVar1 = nn_errno();
    if (iVar1 != 0x16) goto LAB_001015f0;
    iVar1 = nn_symbol_info(0xffffffff,local_38,0x20);
    if (iVar1 != 0) goto LAB_001015f5;
    lVar3 = nn_symbol(2000,0);
    if (lVar3 != 0) goto LAB_001015fa;
    iVar1 = nn_errno();
    if (iVar1 != 0x16) goto LAB_001015ff;
    iVar1 = nn_symbol_info(2000,local_38,0x20);
    if (iVar1 != 0) goto LAB_00101604;
    lVar3 = nn_symbol(6,&local_3c);
    if (lVar3 == 0) goto LAB_00101609;
    if (local_3c != 0) {
      iVar1 = nn_symbol_info(6,local_38,0x20);
      if (iVar1 != 0x20) goto LAB_00101613;
      iVar1 = 0;
      while (lVar3 = nn_symbol(iVar1,&local_3c), lVar3 != 0) {
        iVar1 = iVar1 + 1;
      }
      iVar1 = nn_errno();
      if (iVar1 == 0x16) {
        iVar1 = 0;
        do {
          iVar2 = nn_symbol_info(iVar1,local_38,0x20);
          iVar1 = iVar1 + 1;
        } while (iVar2 != 0);
        return 0;
      }
      main_cold_8();
      goto LAB_001015eb;
    }
  }
  else {
LAB_001015eb:
    main_cold_1();
LAB_001015f0:
    main_cold_2();
LAB_001015f5:
    main_cold_3();
LAB_001015fa:
    main_cold_4();
LAB_001015ff:
    main_cold_5();
LAB_00101604:
    main_cold_6();
LAB_00101609:
    main_cold_10();
  }
  main_cold_9();
LAB_00101613:
  main_cold_7();
}

Assistant:

int main ()
{
    int i;
    struct nn_symbol_properties sym;
    int value;

    nn_assert (nn_symbol (-1, NULL) == NULL);
    nn_assert (nn_errno () == EINVAL);
    nn_assert (nn_symbol_info (-1, &sym, (int) sizeof (sym)) == 0);

    nn_assert (nn_symbol (2000, NULL) == NULL);
    nn_assert (nn_errno () == EINVAL);
    nn_assert (nn_symbol_info (2000, &sym, (int) sizeof (sym)) == 0);

    nn_assert (nn_symbol (6, &value) != NULL);
    nn_assert (value != 0);
    nn_assert (nn_symbol_info (6, &sym, (int) sizeof (sym)) == sizeof (sym));

    for (i = 0; ; ++i) {
        const char* name = nn_symbol (i, &value);
        if (name == NULL) {
            nn_assert (nn_errno () == EINVAL);
            break;
        }
    }

    for (i = 0; ; ++i) {
        if (nn_symbol_info (i, &sym, sizeof (sym)) == 0)
            break;
    }

    return 0;
}